

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t __size;
  long lVar4;
  
  lodepng_info_cleanup(dest);
  memcpy(dest,source,0xe8);
  (dest->color).key_defined = 0;
  (dest->color).key_r = 0;
  (dest->color).key_g = 0;
  (dest->color).key_b = 0;
  (dest->color).colortype = LCT_RGBA;
  (dest->color).bitdepth = 8;
  (dest->color).palette = (uchar *)0x0;
  (dest->color).palettesize = 0;
  uVar1 = lodepng_color_mode_copy(&dest->color,&source->color);
  if (uVar1 != 0) {
    return uVar1;
  }
  dest->text_num = 0;
  dest->text_keys = (char **)0x0;
  dest->text_strings = (char **)0x0;
  uVar3 = 0;
  do {
    if (source->text_num <= uVar3) {
      dest->itext_langtags = (char **)0x0;
      dest->itext_transkeys = (char **)0x0;
      dest->itext_num = 0;
      dest->itext_keys = (char **)0x0;
      dest->itext_strings = (char **)0x0;
      uVar3 = 0;
      do {
        if (source->itext_num <= uVar3) {
          LodePNGUnknownChunks_init(dest);
          LodePNGUnknownChunks_cleanup(dest);
          lVar4 = 0;
          while( true ) {
            if (lVar4 == 3) {
              return 0;
            }
            __size = source->unknown_chunks_size[lVar4];
            dest->unknown_chunks_size[lVar4] = __size;
            puVar2 = (uchar *)malloc(__size);
            dest->unknown_chunks_data[lVar4] = puVar2;
            if (__size != 0 && puVar2 == (uchar *)0x0) break;
            for (uVar3 = 0; uVar3 < __size; uVar3 = uVar3 + 1) {
              dest->unknown_chunks_data[lVar4][uVar3] = source->unknown_chunks_data[lVar4][uVar3];
              __size = source->unknown_chunks_size[lVar4];
            }
            lVar4 = lVar4 + 1;
          }
          return 0x53;
        }
        uVar1 = lodepng_add_itext(dest,source->itext_keys[uVar3],source->itext_langtags[uVar3],
                                  source->itext_transkeys[uVar3],source->itext_strings[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 == 0);
      return uVar1;
    }
    uVar1 = lodepng_add_text(dest,source->text_keys[uVar3],source->text_strings[uVar3]);
    uVar3 = uVar3 + 1;
  } while (uVar1 == 0);
  return uVar1;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source)
{
  lodepng_info_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->color);
  CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
  CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));

  LodePNGUnknownChunks_init(dest);
  CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  return 0;
}